

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O0

int epoll_fd_state(fd_state **fds_p,knote *kn,_Bool disabled)

{
  fd_state *elm;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  fd_state *fds;
  int fd;
  int state;
  bool local_82;
  bool local_81;
  fd_st *in_stack_ffffffffffffff88;
  fd_state *local_30;
  
  local_30 = (fd_state *)*in_RDI;
  if (local_30 == (fd_state *)0x0) {
    local_30 = *(fd_state **)(in_RSI + 0x70);
  }
  if (local_30 == (fd_state *)0x0) {
    elm = (fd_state *)(*(long *)(in_RSI + 0x28) + 2000);
    memset(&stack0xffffffffffffff88,0,0x48);
    local_30 = fd_st_RB_FIND(in_stack_ffffffffffffff88,elm);
    if (local_30 == (fd_state *)0x0) {
      return 0;
    }
  }
  *in_RDI = (long)local_30;
  local_81 = false;
  if (local_30->fds_read != (knote *)0x0) {
    local_81 = (bool)(in_DL & 1) == (((local_30->fds_read->kev).flags & 0x8008) != 0);
  }
  local_82 = false;
  if (local_30->fds_write != (knote *)0x0) {
    local_82 = (bool)(in_DL & 1) == (((local_30->fds_write->kev).flags & 0x8008) != 0);
  }
  return (uint)local_82 << 2 | (uint)local_81;
}

Assistant:

int epoll_fd_state(struct fd_state **fds_p, struct knote *kn, bool disabled)
{
    int             state = 0;
    int             fd = kn->kev.ident;
    struct fd_state *fds = *fds_p;

    if (!fds) {
        fds = kn->kn_fds;
        if(fds) dbg_printf("fd_state: from-kn fd=%i", fd);
    }
    if (!fds) {
        dbg_printf("fd_state: find fd=%i", fd);

        fds = RB_FIND(fd_st, &kn->kn_kq->kq_fd_st, &(struct fd_state){ .fds_fd = fd });
        if (!fds) return (0);
    }

    *fds_p = fds;

    state |= (fds->fds_read && (disabled == ((fds->fds_read->kev.flags & (EV_DISABLE | EV_EOF)) != 0))) * EPOLLIN;
    state |= (fds->fds_write && (disabled == ((fds->fds_write->kev.flags & (EV_DISABLE | EV_EOF)) != 0))) * EPOLLOUT;

    return state;
}